

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O0

Vec_Ptr_t * Nwk_ManRetimeCutBackward(Nwk_Man_t *pMan,int nLatches,int fVerbose)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  void *pvVar4;
  Nwk_Obj_t *pNVar5;
  Vec_Ptr_t *p;
  abctime aVar6;
  abctime clk;
  int Counter2;
  int Counter;
  int RetValue;
  int i;
  Nwk_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  int fVerbose_local;
  int nLatches_local;
  Nwk_Man_t *pMan_local;
  
  clk._4_4_ = 0;
  clk._0_4_ = 0;
  aVar3 = Abc_Clock();
  pMan->nLatches = nLatches;
  iVar1 = Nwk_ManCiNum(pMan);
  pMan->nTruePis = iVar1 - nLatches;
  iVar1 = Nwk_ManCoNum(pMan);
  pMan->nTruePos = iVar1 - nLatches;
  for (Counter = 0; iVar1 = Vec_PtrSize(pMan->vCis), Counter < iVar1; Counter = Counter + 1) {
    pvVar4 = Vec_PtrEntry(pMan->vCis,Counter);
    *(uint *)((long)pvVar4 + 0x20) = *(uint *)((long)pvVar4 + 0x20) & 0xffffffef | 0x10;
  }
  for (Counter = 0; Counter < pMan->nTruePos; Counter = Counter + 1) {
    pNVar5 = (Nwk_Obj_t *)Vec_PtrEntry(pMan->vCos,Counter);
    Nwk_ManMarkTfiCone_rec(pNVar5);
  }
  for (Counter = 0; iVar1 = Vec_PtrSize(pMan->vObjs), Counter < iVar1; Counter = Counter + 1) {
    pNVar5 = (Nwk_Obj_t *)Vec_PtrEntry(pMan->vObjs,Counter);
    if (((pNVar5 != (Nwk_Obj_t *)0x0) && (iVar1 = Nwk_ObjIsNode(pNVar5), iVar1 != 0)) &&
       (iVar1 = Nwk_ObjFaninNum(pNVar5), iVar1 == 0)) {
      *(uint *)&pNVar5->field_0x20 = *(uint *)&pNVar5->field_0x20 & 0xffffffef | 0x10;
    }
  }
  Nwk_ManIncrementTravIdFlow(pMan);
  for (Counter = 0; Counter < pMan->nLatches; Counter = Counter + 1) {
    pNVar5 = (Nwk_Obj_t *)Vec_PtrEntry(pMan->vCos,Counter + pMan->nTruePos);
    pNVar5 = Nwk_ObjFanin0(pNVar5);
    iVar1 = Nwk_ManPushBackwardFast_rec(pNVar5,(Nwk_Obj_t *)0x0);
    if (iVar1 != 0) {
      Nwk_ManIncrementTravIdFlow(pMan);
      clk._4_4_ = clk._4_4_ + 1;
    }
  }
  if (fVerbose != 0) {
    printf("Backward: Max-flow = %4d -> ",(ulong)clk._4_4_);
  }
  Nwk_ManIncrementTravIdFlow(pMan);
  for (Counter = 0; Counter < pMan->nLatches; Counter = Counter + 1) {
    pNVar5 = (Nwk_Obj_t *)Vec_PtrEntry(pMan->vCos,Counter + pMan->nTruePos);
    pNVar5 = Nwk_ObjFanin0(pNVar5);
    iVar1 = Nwk_ManPushBackwardBot_rec(pNVar5,(Nwk_Obj_t *)0x0);
    if (iVar1 != 0) {
      Nwk_ManIncrementTravIdFlow(pMan);
      clk._0_4_ = (int)clk + 1;
    }
  }
  if (fVerbose != 0) {
    printf("%4d.  ",(ulong)(clk._4_4_ + (int)clk));
  }
  if (0 < (int)clk) {
    Nwk_ManIncrementTravIdFlow(pMan);
    for (Counter = 0; Counter < pMan->nLatches; Counter = Counter + 1) {
      pNVar5 = (Nwk_Obj_t *)Vec_PtrEntry(pMan->vCos,Counter + pMan->nTruePos);
      pNVar5 = Nwk_ObjFanin0(pNVar5);
      iVar1 = Nwk_ManPushBackwardBot_rec(pNVar5,(Nwk_Obj_t *)0x0);
      if (iVar1 != 0) {
        __assert_fail("!RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFlow.c"
                      ,0x23a,"Vec_Ptr_t *Nwk_ManRetimeCutBackward(Nwk_Man_t *, int, int)");
      }
    }
  }
  p = Vec_PtrAlloc(clk._4_4_ + (int)clk);
  Counter = 0;
  do {
    iVar1 = Vec_PtrSize(pMan->vObjs);
    if (iVar1 <= Counter) {
      clk._4_4_ = 0;
      for (Counter = 0; Counter < pMan->nLatches; Counter = Counter + 1) {
        pNVar5 = (Nwk_Obj_t *)Vec_PtrEntry(pMan->vCos,Counter + pMan->nTruePos);
        pNVar5 = Nwk_ObjFanin0(pNVar5);
        iVar1 = Nwk_ObjVisitedBotOnly(pNVar5);
        if (iVar1 != 0) {
          clk._4_4_ = clk._4_4_ + 1;
        }
      }
      Nwk_ManCleanMarks(pMan);
      if (fVerbose != 0) {
        uVar2 = Vec_PtrSize(p);
        printf("Min-cut = %4d.  Unmoved = %4d. ",(ulong)uVar2,(ulong)clk._4_4_);
        Abc_Print(1,"%s =","Time");
        aVar6 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar3) * 1.0) / 1000000.0);
      }
      return p;
    }
    pNVar5 = (Nwk_Obj_t *)Vec_PtrEntry(pMan->vObjs,Counter);
    if ((pNVar5 != (Nwk_Obj_t *)0x0) && (iVar1 = Nwk_ObjVisitedBotOnly(pNVar5), iVar1 != 0)) {
      iVar1 = Nwk_ObjHasFlow(pNVar5);
      if (iVar1 == 0) {
        __assert_fail("Nwk_ObjHasFlow(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFlow.c"
                      ,0x243,"Vec_Ptr_t *Nwk_ManRetimeCutBackward(Nwk_Man_t *, int, int)");
      }
      iVar1 = Nwk_ObjIsCo(pNVar5);
      if (iVar1 != 0) {
        __assert_fail("!Nwk_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFlow.c"
                      ,0x244,"Vec_Ptr_t *Nwk_ManRetimeCutBackward(Nwk_Man_t *, int, int)");
      }
      Vec_PtrPush(p,pNVar5);
    }
    Counter = Counter + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Nwk_ManRetimeCutBackward( Nwk_Man_t * pMan, int nLatches, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Nwk_Obj_t * pObj;
    int i, RetValue, Counter = 0, Counter2 = 0;
    abctime clk = Abc_Clock();
    // set the sequential parameters
    pMan->nLatches = nLatches;
    pMan->nTruePis = Nwk_ManCiNum(pMan) - nLatches;
    pMan->nTruePos = Nwk_ManCoNum(pMan) - nLatches;
    // mark the CIs, the TFI of POs, and the constant nodes
    Nwk_ManForEachCi( pMan, pObj, i )
        pObj->MarkA = 1;
    Nwk_ManForEachPoSeq( pMan, pObj, i )
        Nwk_ManMarkTfiCone_rec( pObj );
    Nwk_ManForEachNode( pMan, pObj, i )
        if ( Nwk_ObjFaninNum(pObj) == 0 )
            pObj->MarkA = 1;
    // start flow computation from each LI driver
    Nwk_ManIncrementTravIdFlow( pMan );
    Nwk_ManForEachLiSeq( pMan, pObj, i )
    {
        if ( !Nwk_ManPushBackwardFast_rec( Nwk_ObjFanin0(pObj), NULL ) )
            continue;
        Nwk_ManIncrementTravIdFlow( pMan );
        Counter++; 
    }
    if ( fVerbose ) 
    printf( "Backward: Max-flow = %4d -> ", Counter );
    // continue flow computation from each LI driver
    Nwk_ManIncrementTravIdFlow( pMan );
    Nwk_ManForEachLiSeq( pMan, pObj, i )
    {
        if ( !Nwk_ManPushBackwardBot_rec( Nwk_ObjFanin0(pObj), NULL ) )
            continue;
        Nwk_ManIncrementTravIdFlow( pMan );
        Counter2++;
    }
    if ( fVerbose )
    printf( "%4d.  ", Counter+Counter2 );
    // repeat flow computation from each LI driver
    if ( Counter2 > 0 )
    {
        Nwk_ManIncrementTravIdFlow( pMan );
        Nwk_ManForEachLiSeq( pMan, pObj, i )
        {
            RetValue = Nwk_ManPushBackwardBot_rec( Nwk_ObjFanin0(pObj), NULL );
            assert( !RetValue );
        }
    }
    // cut is a set of nodes whose bottom is visited but top is not visited
    vNodes = Vec_PtrAlloc( Counter+Counter2 );
    Nwk_ManForEachObj( pMan, pObj, i )
    {
        if ( Nwk_ObjVisitedBotOnly(pObj) )
        {
            assert( Nwk_ObjHasFlow(pObj) );
            assert( !Nwk_ObjIsCo(pObj) );
            Vec_PtrPush( vNodes, pObj );
        }
    }
    // count CO drivers
    Counter = 0;
    Nwk_ManForEachLiSeq( pMan, pObj, i )
        if ( Nwk_ObjVisitedBotOnly( Nwk_ObjFanin0(pObj) ) )
            Counter++;
    Nwk_ManCleanMarks( pMan );
//    assert( Nwk_ManRetimeVerifyCutBackward(pMan, vNodes) );
    if ( fVerbose )
    {
    printf( "Min-cut = %4d.  Unmoved = %4d. ", Vec_PtrSize(vNodes), Counter );
    ABC_PRT( "Time", Abc_Clock() - clk );
    }
    return vNodes;
}